

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_instance_array.cpp
# Opt level: O1

void __thiscall embree::InstanceArray::~InstanceArray(InstanceArray *this)

{
  long *plVar1;
  Device *pDVar2;
  Buffer *pBVar3;
  ulong uVar4;
  long lVar5;
  
  (this->super_Geometry).super_RefCount._vptr_RefCount = (_func_int **)&PTR__InstanceArray_022035c8;
  plVar1 = *(long **)&(this->super_Geometry).field_0x58;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x18))();
  }
  if (this->objects != (Accel **)0x0) {
    if (this->numObjects != 0) {
      uVar4 = 0;
      do {
        if (this->objects[uVar4] != (Accel *)0x0) {
          (*(this->objects[uVar4]->super_AccelData).super_RefCount._vptr_RefCount[3])();
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < this->numObjects);
    }
    pDVar2 = (this->super_Geometry).device;
    (*(pDVar2->super_State).super_RefCount._vptr_RefCount[9])(pDVar2,this->objects);
  }
  pDVar2 = (this->super_Geometry).device;
  (*(pDVar2->super_State).super_RefCount._vptr_RefCount[4])(pDVar2,0xffffffffffffff30,0);
  pBVar3 = (this->object_ids).super_RawBufferView.buffer.ptr;
  if (pBVar3 != (Buffer *)0x0) {
    (*(pBVar3->super_RefCount)._vptr_RefCount[3])();
  }
  if ((this->l2w_buf).size_active != 0) {
    lVar5 = 0x30;
    uVar4 = 0;
    do {
      plVar1 = *(long **)((long)&((this->l2w_buf).items)->ptr_ofs + lVar5);
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 0x18))();
      }
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x38;
    } while (uVar4 < (this->l2w_buf).size_active);
  }
  pDVar2 = (this->l2w_buf).alloc.device;
  if (pDVar2 != (Device *)0x0) {
    (*(pDVar2->super_State).super_RefCount._vptr_RefCount[9])(pDVar2,(this->l2w_buf).items);
  }
  (this->l2w_buf).size_active = 0;
  (this->l2w_buf).size_alloced = 0;
  (this->l2w_buf).items = (RawBufferView *)0x0;
  Geometry::~Geometry(&this->super_Geometry);
  return;
}

Assistant:

InstanceArray::~InstanceArray()
  {
    if (object) object->refDec();
    if (objects) {
      for (size_t i = 0; i < numObjects; ++i) {
        if (objects[i]) objects[i]->refDec();
      }
      device->free(objects);
    }
    device->memoryMonitor(-sizeof(*this), false);
  }